

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_get_function_name(JSContext *ctx,JSAtom name)

{
  ulong uVar1;
  ulong uVar2;
  JSValue JVar3;
  
  JVar3 = __JS_AtomToValue(ctx,name,1);
  if ((-1 < (int)name) &&
     (uVar1 = *(ulong *)&ctx->rt->atom_array[name]->field_0x4, uVar2 = uVar1 >> 0x3e,
     uVar2 == 2 || 2 < uVar2 && (uVar1 & 0x3fffffff00000000) == 0)) {
    JVar3 = JS_ConcatString3(ctx,"[",JVar3,"]");
    return JVar3;
  }
  return JVar3;
}

Assistant:

static JSValue js_get_function_name(JSContext *ctx, JSAtom name)
{
    JSValue name_str;

    name_str = JS_AtomToString(ctx, name);
    if (JS_AtomSymbolHasDescription(ctx, name)) {
        name_str = JS_ConcatString3(ctx, "[", name_str, "]");
    }
    return name_str;
}